

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::PanIdQuery
          (CommissionerSafe *this,ErrorHandler *aHandler,uint32_t aChannelMask,uint16_t aPanId,
          string *aDstAddr)

{
  _func_void *p_Var1;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  CommissionerSafe *local_80;
  _Any_data local_78;
  long local_68;
  undefined8 uStack_60;
  uint32_t local_58;
  uint16_t local_54;
  string local_50 [32];
  
  local_80 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_78,aHandler);
  local_58 = aChannelMask;
  local_54 = aPanId;
  std::__cxx11::string::string(local_50,(string *)aDstAddr);
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  p_Var1 = (_func_void *)operator_new(0x50);
  *(CommissionerSafe **)p_Var1 = local_80;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined8 *)(p_Var1 + 0x20) = uStack_60;
  if (local_68 != 0) {
    *(void **)(p_Var1 + 8) = local_78._M_unused._M_object;
    *(undefined8 *)(p_Var1 + 0x10) = local_78._8_8_;
    *(long *)(p_Var1 + 0x18) = local_68;
    local_68 = 0;
    uStack_60 = 0;
  }
  *(uint16_t *)(p_Var1 + 0x2c) = local_54;
  *(uint32_t *)(p_Var1 + 0x28) = local_58;
  std::__cxx11::string::string((string *)(p_Var1 + 0x30),local_50);
  pcStack_90 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:490:22)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:490:22)>
             ::_M_manager;
  local_a8._M_unused._0_8_ = (undefined8)p_Var1;
  PushAsyncRequest(this,(AsyncRequest *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  PanIdQuery(std::function<void(ot::commissioner::Error)>,unsigned_int,unsigned_short,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)&local_80);
  return;
}

Assistant:

void CommissionerSafe::PanIdQuery(ErrorHandler       aHandler,
                                  uint32_t           aChannelMask,
                                  uint16_t           aPanId,
                                  const std::string &aDstAddr)
{
    PushAsyncRequest([=]() { mImpl->PanIdQuery(aHandler, aChannelMask, aPanId, aDstAddr); });
}